

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O3

int tidyCleanAndRepair(TidyDoc tdoc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  Node *node;
  Dict *pDVar13;
  Bool BVar14;
  Bool BVar15;
  uint uVar16;
  Node *pNVar17;
  AttVal *pAVar18;
  tmbstr ptVar19;
  Stack *pSVar20;
  Node *pNVar21;
  uint code;
  long lVar22;
  TidyTagId TVar23;
  char *property;
  AttVal *attval;
  TidyDocImpl *impl;
  bool bVar24;
  
  if (tdoc == (TidyDoc)0x0) {
    return -0x16;
  }
  iVar1 = tdoc[0xd0]._opaque;
  iVar2 = tdoc[0x78]._opaque;
  iVar3 = tdoc[0x7e]._opaque;
  BVar15 = tdoc[0x24]._opaque;
  iVar4 = tdoc[0x5c]._opaque;
  iVar5 = tdoc[0x60]._opaque;
  iVar6 = tdoc[0xe6]._opaque;
  iVar7 = tdoc[0xe2]._opaque;
  iVar8 = tdoc[0xe4]._opaque;
  iVar9 = tdoc[0x80]._opaque;
  iVar10 = tdoc[0x84]._opaque;
  uVar12 = *(undefined8 *)(tdoc + 0xd08);
  *(undefined8 *)(tdoc + 0xd08) = 0;
  if (tdoc[0xec]._opaque != 0) goto LAB_00154096;
  prvTidyCleanStyle((TidyDocImpl *)tdoc,(Node *)tdoc);
  if (iVar10 != 0) {
    prvTidyNestedEmphasis((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  prvTidyList2BQ((TidyDocImpl *)tdoc,(Node *)tdoc);
  prvTidyBQ2Div((TidyDocImpl *)tdoc,(Node *)tdoc);
  if (iVar2 != 0) {
    prvTidyEmFromI((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  if ((iVar1 != 0) && (BVar14 = prvTidyIsWord2000((TidyDocImpl *)tdoc), BVar14 != no)) {
    prvTidyDropSections((TidyDocImpl *)tdoc,(Node *)tdoc);
    prvTidyCleanWord2000((TidyDocImpl *)tdoc,(Node *)tdoc);
    prvTidyDropEmptyElements((TidyDocImpl *)tdoc,(Node *)tdoc);
  }
  if (iVar3 != 0) {
    prvTidyCleanDocument((TidyDocImpl *)tdoc);
  }
  if (iVar4 != 0) {
    prvTidyCleanGoogleDocument((TidyDocImpl *)tdoc);
  }
  prvTidyTidyMetaCharset((TidyDocImpl *)tdoc);
  BVar14 = prvTidyCheckNodeIntegrity((Node *)tdoc);
  if (BVar14 == no) {
    (**(code **)(**(long **)(tdoc + 0xd20) + 0x18))
              (*(long **)(tdoc + 0xd20),"\nPanic - tree has lost its integrity\n");
  }
  pNVar17 = prvTidyFindDocType((TidyDocImpl *)tdoc);
  if (((pNVar17 != (Node *)0x0) &&
      (pAVar18 = prvTidyGetAttrByName(pNVar17,"PUBLIC"), pAVar18 != (AttVal *)0x0)) &&
     (ptVar19 = pAVar18->value, ptVar19 != (tmbstr)0x0)) {
    if (*(long *)(tdoc + 0xd2a) != 0) {
      (**(code **)(**(long **)(tdoc + 0xd20) + 0x10))
                (*(long **)(tdoc + 0xd20),*(long *)(tdoc + 0xd2a));
      ptVar19 = pAVar18->value;
    }
    ptVar19 = prvTidytmbstrdup(*(TidyAllocator **)(tdoc + 0xd20),ptVar19);
    *(tmbstr *)(tdoc + 0xd2a) = ptVar19;
  }
  if (*(long *)(tdoc + 6) != 0) {
    if (iVar5 == 0) {
      if (iVar7 == 0) goto LAB_00153ac9;
      prvTidySetXHTMLDocType((TidyDocImpl *)tdoc);
      BVar14 = yes;
    }
    else {
      if ((*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) != 0) &&
         (pNVar17 = prvTidyFindDocType((TidyDocImpl *)tdoc), pNVar17 != (Node *)0x0)) {
        prvTidyRemoveNode(pNVar17);
      }
LAB_00153ac9:
      prvTidyFixDocType((TidyDocImpl *)tdoc);
      BVar14 = no;
    }
    prvTidyFixAnchors((TidyDocImpl *)tdoc,(Node *)tdoc,BVar15,yes);
    prvTidyFixXhtmlNamespace((TidyDocImpl *)tdoc,BVar14);
    prvTidyFixLanguageInformation((TidyDocImpl *)tdoc,(Node *)tdoc,BVar14,yes);
    if (iVar9 != 0) {
      prvTidyAddGenerator((TidyDocImpl *)tdoc);
    }
  }
  if ((iVar6 != 0) && (iVar8 != 0)) {
    prvTidyFixXmlDecl((TidyDocImpl *)tdoc);
  }
  if (*(long *)(tdoc + 0x1c) != 0) {
    if ((*(byte *)(*(long *)(tdoc + 0x1c) + 0x2a) & 6) != 0) {
      pSVar20 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
      iVar1 = tdoc[0x7e]._opaque;
      iVar2 = tdoc[0xc0]._opaque;
      pNVar21 = prvTidyFindBody((TidyDocImpl *)tdoc);
      pNVar17 = (Node *)tdoc;
      do {
        node = pNVar17->next;
        for (pAVar18 = pNVar17->attributes; pAVar18 != (AttVal *)0x0; pAVar18 = pAVar18->next) {
          if ((pAVar18->dict != (Attribute *)0x0) && (pAVar18->dict->id == TidyAttr_ALIGN)) {
            if (iVar2 == 0) {
              pAVar18 = prvTidyAttrGetById(pNVar17,TidyAttr_ALIGN);
              prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar17,pAVar18,0x255);
              if (pNVar17 == pNVar21) goto LAB_00153d0f;
              bVar24 = false;
            }
            else {
              bVar24 = true;
              if (pNVar17 == pNVar21) goto LAB_00153dd4;
            }
            goto LAB_00153bb9;
          }
        }
        bVar24 = iVar2 != 0;
        if (pNVar17 == pNVar21) {
          if (iVar2 == 0) {
LAB_00153d0f:
            lVar22 = 0;
            do {
              pAVar18 = prvTidyAttrGetById(pNVar17,*(TidyAttrId *)((long)BadBody5Attribs + lVar22));
              if (pAVar18 != (AttVal *)0x0) {
                prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar17,pAVar18,0x255);
              }
              lVar22 = lVar22 + 4;
            } while (lVar22 != 0x18);
          }
        }
        else {
LAB_00153bb9:
          if (pNVar17->tag == (Dict *)0x0) {
LAB_00153c8b:
            BVar15 = prvTidynodeIsElement(pNVar17);
            if ((BVar15 != no) && (pDVar13 = pNVar17->tag, pDVar13 != (Dict *)0x0)) {
              if ((pDVar13->versions & 0x6e000) == 0) goto LAB_00153dba;
              lVar22 = 8;
              do {
                if (*(TidyTagId *)((long)&html5Info[0].tag + lVar22) == pDVar13->id)
                goto LAB_00153dba;
                lVar22 = lVar22 + 0x10;
              } while (lVar22 != 200);
            }
          }
          else {
            TVar23 = pNVar17->tag->id;
            if ((int)TVar23 < 0x24) {
              if ((int)TVar23 < 0xd) {
                if (TVar23 == TidyTag_ACRONYM) {
                  if (iVar1 != 0) {
                    TVar23 = TidyTag_ABBR;
LAB_00153dab:
                    prvTidyCoerceNode((TidyDocImpl *)tdoc,pNVar17,TVar23,yes,no);
                    goto LAB_00153dd4;
                  }
                }
                else if (TVar23 == TidyTag_APPLET) {
                  if (iVar1 != 0) {
                    TVar23 = TidyTag_OBJECT;
                    goto LAB_00153dab;
                  }
                }
                else if (TVar23 != TidyTag_BASEFONT) goto LAB_00153c8b;
              }
              else if (TVar23 == TidyTag_BIG) {
                if (iVar1 != 0) {
                  property = "font-size: larger";
                  goto LAB_00153d9b;
                }
              }
              else if ((TVar23 != TidyTag_CENTER) && (TVar23 != TidyTag_DIR)) goto LAB_00153c8b;
            }
            else if ((int)TVar23 < 0x48) {
              if ((1 < TVar23 - TidyTag_FRAME) && (TVar23 != TidyTag_FONT)) goto LAB_00153c8b;
            }
            else if (TVar23 != TidyTag_NOFRAMES) {
              if (TVar23 == TidyTag_STRIKE) {
                if (iVar1 != 0) {
                  property = "text-decoration: line-through";
LAB_00153d9b:
                  prvTidyAddStyleProperty((TidyDocImpl *)tdoc,pNVar17,property);
                  TVar23 = TidyTag_SPAN;
                  goto LAB_00153dab;
                }
              }
              else {
                if (TVar23 != TidyTag_TT) goto LAB_00153c8b;
                if (iVar1 != 0) {
                  property = "font-family: monospace";
                  goto LAB_00153d9b;
                }
              }
            }
LAB_00153dba:
            if (!bVar24) {
              prvTidyReport((TidyDocImpl *)tdoc,pNVar17,pNVar17,0x271);
            }
          }
        }
LAB_00153dd4:
        if (pNVar17->content == (Node *)0x0) {
          pNVar17 = node;
          if (node == (Node *)0x0) {
            pNVar17 = prvTidypop(pSVar20);
          }
        }
        else {
          prvTidypush(pSVar20,node);
          pNVar17 = pNVar17->content;
        }
      } while (pNVar17 != (Node *)0x0);
      prvTidyfreeStack(pSVar20);
    }
    pSVar20 = prvTidynewStack((TidyDocImpl *)tdoc,0x10);
    uVar16 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x24);
    uVar11 = *(uint *)(*(long *)(tdoc + 0x1c) + 0x28);
    if (uVar11 == 0) {
      uVar11 = uVar16;
    }
    bVar24 = (uVar11 & 0x60124) == 0;
    iVar1 = tdoc[0xc0]._opaque;
    pNVar17 = (Node *)tdoc;
    do {
      pNVar21 = pNVar17->next;
      BVar15 = prvTidynodeIsElement(pNVar17);
      if (((BVar15 != no) && (pDVar13 = pNVar17->tag, pDVar13 != (Dict *)0x0)) &&
         (tdoc[0xec]._opaque == 0)) {
        if ((iVar1 == 0) || ((pDVar13->versions & uVar11) != 0)) {
          if (((pDVar13->versions & 0xe000) != 0) &&
             ((tdoc[0x7e]._opaque == 0 ||
              ((pDVar13->id != TidyTag_NOBR && (pDVar13->id != TidyTag_WBR)))))) {
            BVar15 = prvTidynodeIsAutonomousCustomFormat(pNVar17);
            if (((uVar16 & 0x60000) == 0) || (BVar15 == no)) {
              prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar17,0x270);
            }
            if (pNVar17->tag != (Dict *)0x0) {
              TVar23 = pNVar17->tag->id;
              if (TVar23 == TidyTag_SPACER) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 1;
              }
              else if (TVar23 == TidyTag_NOBR) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 4;
              }
              else if (TVar23 == TidyTag_LAYER) {
                *(byte *)&tdoc[0xd18]._opaque = (byte)tdoc[0xd18]._opaque | 2;
              }
            }
          }
        }
        else {
          prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar17,bVar24 + 0x239);
        }
      }
      BVar15 = prvTidynodeIsElement(pNVar17);
      if (BVar15 != no) {
        pAVar18 = pNVar17->attributes;
LAB_00153f76:
        while (attval = pAVar18, attval != (AttVal *)0x0) {
          pAVar18 = attval->next;
          BVar15 = prvTidyAttributeIsProprietary(pNVar17,attval);
          if ((uVar16 & 0x60000) == 0 && iVar1 == 0) goto LAB_00153fc9;
          BVar14 = prvTidyAttributeIsMismatched(pNVar17,attval,(TidyDocImpl *)tdoc);
          if (BVar15 != no) goto LAB_00153fce;
          if (BVar14 != no) {
            code = bVar24 | 0x254;
            if ((uVar16 & 0x60000) != 0) {
              code = (iVar1 == 0) + 0x254;
            }
            goto LAB_00153fe5;
          }
        }
      }
      if (pNVar17->content == (Node *)0x0) {
        if (pNVar21 == (Node *)0x0) {
          pNVar21 = prvTidypop(pSVar20);
        }
      }
      else {
        prvTidypush(pSVar20,pNVar21);
        pNVar21 = pNVar17->content;
      }
      pNVar17 = pNVar21;
    } while (pNVar21 != (Node *)0x0);
    prvTidyfreeStack(pSVar20);
    if ((*(int *)(*(long *)(tdoc + 0x1c) + 0x1c) == 0) && (tdoc[0xd1d]._opaque != 0)) {
      pNVar17 = prvTidyFindXmlDecl((TidyDocImpl *)tdoc);
      prvTidyReport((TidyDocImpl *)tdoc,(Node *)0x0,pNVar17,0x291);
    }
  }
  prvTidyCleanHead((TidyDocImpl *)tdoc);
LAB_00154096:
  *(undefined8 *)(tdoc + 0xd08) = uVar12;
  uVar16 = 2;
  if ((tdoc[0xd11]._opaque == 0) && (uVar16 = 1, tdoc[0xd12]._opaque == 0)) {
    uVar16 = (uint)(tdoc[0xd13]._opaque != 0);
  }
  return uVar16;
LAB_00153fc9:
  if (BVar15 != no) {
LAB_00153fce:
    if (tdoc[0xce]._opaque != 0) {
      code = 0x26f;
LAB_00153fe5:
      prvTidyReportAttrError((TidyDocImpl *)tdoc,pNVar17,attval,code);
    }
    if (tdoc[0x40]._opaque != 0) {
      prvTidyRemoveAttribute((TidyDocImpl *)tdoc,pNVar17,attval);
    }
  }
  goto LAB_00153f76;
}

Assistant:

int TIDY_CALL        tidyCleanAndRepair( TidyDoc tdoc )
{
    TidyDocImpl* impl = tidyDocToImpl( tdoc );
    if ( impl )
      return tidyDocCleanAndRepair( impl );
    return -EINVAL;
}